

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O3

size_t __thiscall Imf_3_4::IDManifest::find(IDManifest *this,string *channel)

{
  const_iterator cVar1;
  size_t sVar2;
  pointer pCVar3;
  size_t sVar4;
  long lVar5;
  
  pCVar3 = (this->_manifest).
           super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_manifest).
      super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ._M_impl.super__Vector_impl_data._M_finish == pCVar3) {
    sVar2 = 0;
  }
  else {
    lVar5 = 0;
    sVar4 = 0;
    do {
      cVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(&(pCVar3->_channels)._M_t._M_impl.field_0x0 + lVar5),channel);
      pCVar3 = (this->_manifest).
               super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((_Base_ptr)
          ((long)&(pCVar3->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar5)
          != cVar1._M_node) {
        return sVar4;
      }
      sVar4 = sVar4 + 1;
      sVar2 = ((long)(this->_manifest).
                     super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 4) *
              0x4ec4ec4ec4ec4ec5;
      lVar5 = lVar5 + 0xd0;
    } while (sVar4 < sVar2);
  }
  return sVar2;
}

Assistant:

size_t
IDManifest::find (const string& channel) const
{
    // search the set of channels for each ChannelGroupManifest searching for
    // one that contains 'channel'
    for (size_t i = 0; i < _manifest.size (); ++i)
    {

        if (_manifest[i].getChannels ().find (channel) !=
            _manifest[i].getChannels ().end ())
        {
            return i;
        }
    }
    //  not find, return size()
    return _manifest.size ();
}